

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-bin-cursor.c
# Opt level: O0

int coda_bin_cursor_read_int8_partial_array
              (coda_cursor_conflict *cursor,long offset,long length,int8_t *dst)

{
  coda_type *local_40;
  coda_type_array *type;
  int8_t *dst_local;
  long length_local;
  long offset_local;
  coda_cursor_conflict *cursor_local;
  
  if ((cursor->stack[cursor->n + -1].type)->backend < coda_backend_memory) {
    local_40 = (coda_type *)cursor->stack[cursor->n + -1].type;
  }
  else {
    local_40 = (cursor->stack[cursor->n + -1].type)->definition;
  }
  if ((*(coda_type **)(local_40 + 1))->format == coda_format_binary) {
    cursor_local._4_4_ =
         read_partial_array(cursor,coda_bin_cursor_read_int8,offset,length,(uint8_t *)dst,1);
  }
  else {
    if ((*(coda_type **)(local_40 + 1))->format != coda_format_ascii) {
      __assert_fail("type->base_type->format == coda_format_ascii",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-bin-cursor.c"
                    ,0x4a8,
                    "int coda_bin_cursor_read_int8_partial_array(const coda_cursor *, long, long, int8_t *)"
                   );
    }
    cursor_local._4_4_ =
         read_partial_array(cursor,coda_ascii_cursor_read_int8,offset,length,(uint8_t *)dst,1);
  }
  return cursor_local._4_4_;
}

Assistant:

int coda_bin_cursor_read_int8_partial_array(const coda_cursor *cursor, long offset, long length, int8_t *dst)
{
    coda_type_array *type = (coda_type_array *)coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type);

    if (type->base_type->format == coda_format_binary)
    {
        return read_partial_array(cursor, (read_function)&coda_bin_cursor_read_int8, offset, length, (uint8_t *)dst,
                                  sizeof(int8_t));
    }
    assert(type->base_type->format == coda_format_ascii);
    return read_partial_array(cursor, (read_function)&coda_ascii_cursor_read_int8, offset, length, (uint8_t *)dst,
                              sizeof(int8_t));
}